

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall raft_functional_common::TestMgr::TestMgr(TestMgr *this,int srv_id,string *endpoint)

{
  undefined1 local_85;
  undefined1 local_84 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  __shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_48;
  
  (this->super_state_mgr)._vptr_state_mgr = (_func_int **)&PTR__TestMgr_006069b8;
  this->myId = srv_id;
  local_84._4_4_ = srv_id;
  std::__cxx11::string::string((string *)&this->myEndpoint,(string *)endpoint);
  std::make_shared<nuraft::inmem_log_store>();
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->savedState).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->savedConfig).super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_84._0_4_ = 1;
  std::__cxx11::to_string(&local_48,srv_id);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_84 + 0xc),"server ",&local_48);
  local_85 = 0;
  local_84._8_4_ = 0x32;
  std::
  make_shared<nuraft::srv_config,int&,int,std::__cxx11::string_const&,std::__cxx11::string,bool,int>
            ((int *)&local_58,(int *)(local_84 + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_84,endpoint,
             (bool *)(local_84 + 0xc),(int *)&local_85);
  std::__shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->mySrvConfig).super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
             ,&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
  std::__cxx11::string::~string((string *)(local_84 + 0xc));
  std::__cxx11::string::~string((string *)&local_48);
  std::make_shared<nuraft::cluster_config>();
  std::__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->savedConfig).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2> *)(local_84 + 0xc));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
  std::__cxx11::
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>::
  push_back(&((this->savedConfig).
              super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             servers_,&this->mySrvConfig);
  return;
}

Assistant:

TestMgr(int srv_id,
            const std::string& endpoint)
        : myId(srv_id)
        , myEndpoint(endpoint)
        , curLogStore( cs_new<inmem_log_store>() )
    {
        mySrvConfig = cs_new<srv_config>
                      ( srv_id,
                        1,
                        endpoint,
                        "server " + std::to_string(srv_id),
                        false,
                        50 );

        savedConfig = cs_new<cluster_config>();
        savedConfig->get_servers().push_back(mySrvConfig);
    }